

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filewatcher.cpp
# Opt level: O2

void FileWatcherRemoveWatch(HFileWatcher handle,char *watch)

{
  char *local_20;
  
  local_20 = watch;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)((long)handle + 0x38))->__data);
  std::
  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
            (*(undefined8 *)((long)handle + 0x10),*(undefined8 *)((long)handle + 0x18),&local_20);
  if (0x20 < (ulong)(*(long *)((long)handle + 0x18) - *(long *)((long)handle + 0x10))) {
    std::__cxx11::string::swap((string *)(*(long *)((long)handle + 0x18) + -0x20));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)handle + 0x10));
  pthread_mutex_unlock((pthread_mutex_t *)((long)handle + 0x38));
  return;
}

Assistant:

void FileWatcherRemoveWatch(HFileWatcher handle, const char* watch) {
    FileWatcher* watcher = (FileWatcher*)handle;
    std::lock_guard<std::mutex> guard(watcher->Mutex);
    auto it = std::find(watcher->Watches.begin(), watcher->Watches.end(), watch);
    if (watcher->Watches.size() > 1) {
        std::swap(watcher->Watches.back(), *it);
    }
    watcher->Watches.pop_back();
}